

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioVoice_SetOutputFilterParameters
                   (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
                   FAudioFilterParameters *pParameters,uint32_t OperationSet)

{
  FAudioSendDescriptor *pFVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    uVar3 = 0;
    if (voice->type != FAUDIO_VOICE_MASTER) {
      FAudio_PlatformLockMutex(voice->sendLock);
      uVar2 = (voice->sends).SendCount;
      if (pDestinationVoice == (FAudioVoice *)0x0) {
        if (uVar2 == 1) {
          pDestinationVoice = ((voice->sends).pSends)->pOutputVoice;
          uVar2 = 1;
        }
        else {
          pDestinationVoice = (FAudioVoice *)0x0;
        }
      }
      for (lVar4 = 0; (ulong)uVar2 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
        pFVar1 = (voice->sends).pSends;
        if (pDestinationVoice == *(FAudioVoice **)((long)&pFVar1->pOutputVoice + lVar4)) {
          if ((*(byte *)((long)&pFVar1->Flags + lVar4) & 0x80) != 0) {
            SDL_memcpy((long)&voice->sendFilter->Type + lVar4,pParameters,0xc);
          }
          FAudio_PlatformUnlockMutex(voice->sendLock);
          goto LAB_0011405f;
        }
      }
      FAudio_PlatformUnlockMutex(voice->sendLock);
      uVar3 = 0x88960001;
    }
  }
  else {
    FAudio_OPERATIONSET_QueueSetOutputFilterParameters
              (voice,pDestinationVoice,pParameters,OperationSet);
LAB_0011405f:
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint32_t FAudioVoice_SetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	const FAudioFilterParameters *pParameters,
	uint32_t OperationSet
) {
	uint32_t i;
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetOutputFilterParameters(
			voice,
			pDestinationVoice,
			pParameters,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		&voice->sendFilter[i],
		pParameters,
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}